

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

void __thiscall arangodb::velocypack::ArrayIterator::ArrayIterator(ArrayIterator *this,Slice slice)

{
  ValueLength VVar1;
  uint8_t *puVar2;
  Exception *this_00;
  Slice slice_local;
  
  (this->_slice)._start = slice._start;
  this->_current = (uint8_t *)0x0;
  this->_size = 0;
  this->_position = 0;
  slice_local = slice;
  if (SliceStaticData::TypeMap[*slice._start] == Array) {
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::arrayLength
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &slice_local);
    this->_size = VVar1;
    puVar2 = first(this);
    this->_current = puVar2;
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting Array slice");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

explicit ArrayIterator(Slice slice)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Array)) {
      throw Exception{Exception::InvalidValueType, "Expecting Array slice"};
    }
    _size = slice.arrayLength();
    _current = first();
  }